

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_237::FindingApplier::handleRefinement(FindingApplier *this,Expression *curr)

{
  BinaryLocation BVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  Type type_;
  Function *pFVar5;
  Expression *pEVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  Index IVar9;
  _Hash_node_base *p_Var10;
  LocalSet *this_00;
  mapped_type *pmVar11;
  ulong uVar12;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false> __it
  ;
  Type in_R8;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  LocalSet *local_38;
  
  uVar2 = (this->finder->lessCastedGets)._M_h._M_bucket_count;
  uVar12 = (ulong)curr % uVar2;
  p_Var13 = (this->finder->lessCastedGets)._M_h._M_buckets[uVar12];
  p_Var14 = (__node_base_ptr)0x0;
  if ((p_Var13 != (__node_base_ptr)0x0) &&
     (in_R8.id = (uintptr_t)p_Var13->_M_nxt, p_Var14 = p_Var13,
     (Expression *)((__node_base_ptr)(in_R8.id + 8))->_M_nxt != curr)) {
    while (p_Var13 = (__node_base_ptr)in_R8.id, in_R8.id = (uintptr_t)p_Var13->_M_nxt,
          (_Hash_node_base *)in_R8.id != (_Hash_node_base *)0x0) {
      p_Var14 = (__node_base_ptr)0x0;
      if (((ulong)((_Hash_node_base *)(in_R8.id + 8))->_M_nxt % uVar2 != uVar12) ||
         (p_Var14 = p_Var13, (Expression *)((_Hash_node_base *)(in_R8.id + 8))->_M_nxt == curr))
      goto LAB_007efe12;
    }
    p_Var14 = (__node_base_ptr)0x0;
  }
LAB_007efe12:
  if (p_Var14 == (__node_base_ptr)0x0) {
    p_Var10 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var10 = p_Var14->_M_nxt;
  }
  if (p_Var10 != (_Hash_node_base *)0x0) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (curr->type).id;
    IVar9 = Builder::addVar((Builder *)
                            (this->
                            super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                            ).
                            super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar8 << 0x40),in_R8);
    p_Var3 = p_Var10[3]._M_nxt;
    for (p_Var10 = p_Var10[2]._M_nxt; p_Var10 != p_Var3; p_Var10 = p_Var10 + 1) {
      p_Var4 = p_Var10->_M_nxt;
      *(Index *)&p_Var4[2]._M_nxt = IVar9;
      p_Var4[1]._M_nxt = (_Hash_node_base *)(curr->type).id;
    }
    type_.id = (curr->type).id;
    this_00 = (LocalSet *)
              MixedArena::allocSpace
                        (&((this->
                           super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                           ).
                           super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                          .currModule)->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
    this_00->index = IVar9;
    this_00->value = curr;
    LocalSet::makeTee(this_00,type_);
    pFVar5 = (this->
             super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
             ).
             super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
             .currFunction;
    local_38 = this_00;
    if ((pFVar5 != (Function *)0x0) && ((pFVar5->debugLocations)._M_h._M_element_count != 0)) {
      pEVar6 = *(this->
                super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                ).
                super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                .replacep;
      uVar2 = (pFVar5->debugLocations)._M_h._M_bucket_count;
      uVar12 = (ulong)pEVar6 % uVar2;
      p_Var13 = (pFVar5->debugLocations)._M_h._M_buckets[uVar12];
      p_Var14 = (__node_base_ptr)0x0;
      if ((p_Var13 != (__node_base_ptr)0x0) &&
         (p_Var10 = p_Var13->_M_nxt, p_Var14 = p_Var13,
         pEVar6 != (Expression *)p_Var13->_M_nxt[1]._M_nxt)) {
        while (p_Var13 = p_Var10, p_Var10 = p_Var13->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
          p_Var14 = (__node_base_ptr)0x0;
          if (((ulong)p_Var10[1]._M_nxt % uVar2 != uVar12) ||
             (p_Var14 = p_Var13, pEVar6 == (Expression *)p_Var10[1]._M_nxt)) goto LAB_007eff2e;
        }
        p_Var14 = (__node_base_ptr)0x0;
      }
LAB_007eff2e:
      if (p_Var14 == (__node_base_ptr)0x0) {
        __it._M_cur = (__node_type *)0x0;
      }
      else {
        __it._M_cur = (__node_type *)p_Var14->_M_nxt;
      }
      if (__it._M_cur != (__node_type *)0x0) {
        BVar1 = *(BinaryLocation *)((long)__it._M_cur + 0x18);
        uVar7 = *(undefined8 *)((long)__it._M_cur + 0x10);
        std::
        _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&(pFVar5->debugLocations)._M_h,(const_iterator)__it._M_cur);
        pmVar11 = std::__detail::
                  _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pFVar5->debugLocations,(key_type *)&local_38);
        pmVar11->fileIndex = (int)uVar7;
        pmVar11->lineNumber = (int)((ulong)uVar7 >> 0x20);
        pmVar11->columnNumber = BVar1;
      }
    }
    *(this->
     super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
     ).
     super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
     .replacep = (Expression *)local_38;
  }
  return;
}

Assistant:

void handleRefinement(Expression* curr) {
    auto iter = finder.lessCastedGets.find(curr);
    if (iter == finder.lessCastedGets.end()) {
      return;
    }

    // This expression was the best cast for some gets. Add a new local to
    // store this value, then use it for the gets.
    auto var = Builder::addVar(getFunction(), curr->type);
    auto& gets = iter->second;
    for (auto* get : gets) {
      get->index = var;
      get->type = curr->type;
    }

    // Replace ourselves with a tee.
    replaceCurrent(Builder(*getModule()).makeLocalTee(var, curr, curr->type));
  }